

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SF_FlateLzwDecode.cc
# Opt level: O3

bool __thiscall
SF_FlateLzwDecode::setDecodeParms(SF_FlateLzwDecode *this,QPDFObjectHandle *decode_parms)

{
  _Rb_tree_node_base *p_Var1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  unsigned_long_long uVar5;
  _Base_ptr p_Var6;
  bool bVar7;
  QPDFObjectHandle value;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys;
  QPDFLogger *local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  QPDFObjectHandle local_70;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  bVar2 = QPDFObjectHandle::isNull(decode_parms);
  bVar7 = true;
  if (!bVar2) {
    uVar5 = Pl_Flate::memory_limit();
    QPDFObjectHandle::getKeys_abi_cxx11_
              ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_60,decode_parms);
    if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_60._M_impl.super__Rb_tree_header) {
      p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        p_Var1 = p_Var6 + 1;
        QPDFObjectHandle::getKey(&local_70,(string *)decode_parms);
        iVar3 = std::__cxx11::string::compare((char *)p_Var1);
        if (iVar3 != 0) {
          iVar3 = std::__cxx11::string::compare((char *)p_Var1);
          if (((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)p_Var1), iVar3 == 0))
             || (iVar3 = std::__cxx11::string::compare((char *)p_Var1), iVar3 == 0)) {
            bVar2 = QPDFObjectHandle::isInteger(&local_70);
            if (bVar2) {
              uVar4 = QPDFObjectHandle::getIntValueAsInt(&local_70);
              if (uVar4 <= uVar5 || uVar5 == 0) {
                iVar3 = std::__cxx11::string::compare((char *)p_Var1);
                if (iVar3 == 0) {
                  this->columns = uVar4;
                }
                else {
                  iVar3 = std::__cxx11::string::compare((char *)p_Var1);
                  if (iVar3 == 0) {
                    this->colors = uVar4;
                  }
                  else {
                    iVar3 = std::__cxx11::string::compare((char *)p_Var1);
                    if (iVar3 == 0) {
                      this->bits_per_component = uVar4;
                    }
                  }
                }
                goto LAB_00249dbc;
              }
              QPDFLogger::defaultLogger();
              QPDFLogger::warn(local_80,
                               "SF_FlateLzwDecode parameter exceeds PL_Flate memory limit\n");
              if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
              }
            }
          }
          else {
            if ((this->lzw != true) ||
               (iVar3 = std::__cxx11::string::compare((char *)p_Var1), iVar3 != 0))
            goto LAB_00249dbc;
            bVar2 = QPDFObjectHandle::isInteger(&local_70);
            if (bVar2) {
              uVar4 = QPDFObjectHandle::getIntValueAsInt(&local_70);
              this->early_code_change = uVar4 == 1;
              goto joined_r0x00249dae;
            }
          }
LAB_00249e22:
          if (local_70.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_70.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          bVar7 = false;
          goto LAB_00249e33;
        }
        bVar2 = QPDFObjectHandle::isInteger(&local_70);
        if (!bVar2) goto LAB_00249e22;
        iVar3 = QPDFObjectHandle::getIntValueAsInt(&local_70);
        this->predictor = iVar3;
        if (5 < iVar3 - 10U) {
          uVar4 = iVar3 - 1;
joined_r0x00249dae:
          if (1 < uVar4) goto LAB_00249e22;
        }
LAB_00249dbc:
        if (local_70.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_70.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      } while ((_Rb_tree_header *)p_Var6 != &local_60._M_impl.super__Rb_tree_header);
    }
    bVar7 = this->columns != 0 || this->predictor < 2;
LAB_00249e33:
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_60);
  }
  return bVar7;
}

Assistant:

bool
SF_FlateLzwDecode::setDecodeParms(QPDFObjectHandle decode_parms)
{
    if (decode_parms.isNull()) {
        return true;
    }

    auto memory_limit = Pl_Flate::memory_limit();

    std::set<std::string> keys = decode_parms.getKeys();
    for (auto const& key: keys) {
        QPDFObjectHandle value = decode_parms.getKey(key);
        if (key == "/Predictor") {
            if (value.isInteger()) {
                predictor = value.getIntValueAsInt();
                if (!(predictor == 1 || predictor == 2 || (predictor >= 10 && predictor <= 15))) {
                    return false;
                }
            } else {
                return false;
            }
        } else if (key == "/Columns" || key == "/Colors" || key == "/BitsPerComponent") {
            if (value.isInteger()) {
                int val = value.getIntValueAsInt();
                if (memory_limit && static_cast<unsigned int>(val) > memory_limit) {
                    QPDFLogger::defaultLogger()->warn(
                        "SF_FlateLzwDecode parameter exceeds PL_Flate memory limit\n");
                    return false;
                }
                if (key == "/Columns") {
                    columns = val;
                } else if (key == "/Colors") {
                    colors = val;
                } else if (key == "/BitsPerComponent") {
                    bits_per_component = val;
                }
            } else {
                return false;
            }
        } else if (lzw && (key == "/EarlyChange")) {
            if (value.isInteger()) {
                int earlychange = value.getIntValueAsInt();
                early_code_change = (earlychange == 1);
                if (!(earlychange == 0 || earlychange == 1)) {
                    return false;
                }
            } else {
                return false;
            }
        }
    }

    if (predictor > 1 && columns == 0) {
        return false;
    }

    return true;
}